

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadSmt.c
# Opt level: O3

Wlc_Ntk_t * Smt_PrsBuild(Smt_Prs_t *p)

{
  Vec_Int_t *pVVar1;
  long lVar2;
  undefined1 auVar3 [16];
  int iVar4;
  int iVar5;
  int iVar6;
  Vec_Int_t *p_00;
  int *piVar7;
  char *pcVar8;
  Wlc_Ntk_t *p_01;
  Abc_Nam_t *pAVar9;
  byte *pbVar10;
  char *pcVar11;
  void *__ptr;
  uint uVar12;
  uint uVar13;
  Vec_Int_t *pVVar14;
  ulong uVar15;
  int iVar16;
  uint uVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  int fFound;
  int fFound_1;
  int local_38;
  int local_34;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar7 = (int *)malloc(400);
  p_00->pArray = piVar7;
  if ((p->vObjs).nSize < 1) {
LAB_003119c7:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWec.h"
                  ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
  }
  pVVar14 = (p->vObjs).pArray;
  iVar16 = pVVar14->nSize;
  if (0 < iVar16) {
    lVar18 = 0;
    do {
      uVar12 = pVVar14->pArray[lVar18];
      if ((int)uVar12 < 0) goto LAB_00311989;
      if ((uVar12 & 1) != 0) {
        __assert_fail("!Smt_EntryIsName(Fan)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                      ,0x1ec,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
      }
      uVar12 = uVar12 >> 1;
      if ((p->vObjs).nSize <= (int)uVar12) goto LAB_003119c7;
      pVVar1 = (p->vObjs).pArray;
      if (pVVar1[uVar12].nSize < 1) goto LAB_003119a8;
      uVar12 = *pVVar1[uVar12].pArray;
      if ((int)uVar12 < 0) goto LAB_00311989;
      if ((uVar12 & 1) == 0) {
        __assert_fail("Smt_EntryIsName(Fan)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                      ,0x1ef,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
      }
      if (0x15 < uVar12) {
        pcVar8 = Abc_NamStr(p->pStrs,uVar12 >> 1);
        printf("Ignoring directive \"%s\".\n",pcVar8);
        iVar16 = pVVar14->nSize;
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 < iVar16);
  }
  p_01 = Wlc_NtkAlloc(p->pName,1000);
  pAVar9 = Abc_NamStart(1000,0x18);
  p_01->pManName = pAVar9;
  p_01->fSmtLib = 1;
  uVar12 = (p->vObjs).nSize;
  if ((int)uVar12 < 1) {
LAB_00311717:
    p_00->nSize = 0;
LAB_00311724:
    iVar16 = 0;
LAB_00311726:
    iVar16 = Smt_PrsCreateNode(p_01,0x17,0,iVar16,p_00,(char *)0x0);
    piVar7 = p_00->pArray;
    if (p_00->nCap < 1) {
      if (piVar7 == (int *)0x0) {
        piVar7 = (int *)malloc(4);
      }
      else {
        piVar7 = (int *)realloc(piVar7,4);
      }
      p_00->pArray = piVar7;
      if (piVar7 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      p_00->nCap = 1;
    }
    *piVar7 = iVar16;
    p_00->nSize = 1;
    uVar12 = Wlc_ObjAlloc(p_01,0x25,0,0,0);
    if (((int)uVar12 < 1) || (p_01->nObjsAlloc <= (int)uVar12)) goto LAB_00311bf5;
    Wlc_ObjAddFanins(p_01,p_01->pObjs + uVar12,p_00);
    pAVar9 = p_01->pManName;
    piVar7 = &local_34;
  }
  else {
    pVVar14 = &p_01->vValues;
    lVar18 = 0;
    lVar19 = 8;
    iVar16 = 0;
    do {
      pVVar1 = (p->vObjs).pArray;
      iVar4 = *(int *)((long)pVVar1 + lVar19 + -4);
      if (0 < iVar4) {
        piVar7 = *(int **)((long)&pVVar1->nCap + lVar19);
        iVar5 = *piVar7;
        if (iVar5 < 0) goto LAB_00311989;
        if (iVar5 == 0xb) {
          if (iVar4 != 4) {
            __assert_fail("Vec_IntSize(vFans) == 4",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                          ,0x1f9,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
          }
          uVar12 = piVar7[1];
          if ((int)uVar12 < 0) goto LAB_00311989;
          if ((uVar12 & 1) == 0) {
            __assert_fail("Smt_EntryIsName(Fan)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                          ,0x1fd,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
          }
          pcVar8 = Abc_NamStr(p->pStrs,uVar12 >> 1);
          iVar4 = *(int *)((long)pVVar1 + lVar19 + -4);
          if (iVar4 < 3) goto LAB_003119a8;
          lVar2 = *(long *)((long)&pVVar1->nCap + lVar19);
          uVar12 = *(uint *)(lVar2 + 8);
          if ((int)uVar12 < 0) goto LAB_00311989;
          if ((uVar12 & 1) != 0) {
            __assert_fail("!Smt_EntryIsName(Fan)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                          ,0x201,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
          }
          if (iVar4 == 3) goto LAB_003119a8;
          uVar12 = *(uint *)(lVar2 + 0xc);
          if ((int)uVar12 < 0) goto LAB_00311989;
          if ((uVar12 & 1) == 0) {
            uVar12 = uVar12 >> 1;
            if ((p->vObjs).nSize <= (int)uVar12) goto LAB_003119c7;
            pVVar1 = (p->vObjs).pArray;
            if (pVVar1[uVar12].nSize != 3) {
              __assert_fail("Vec_IntSize(vFans2) == 3",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                            ,0x211,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
            }
            if (*pVVar1[uVar12].pArray < 0) goto LAB_00311989;
            pbVar10 = (byte *)Abc_NamStr(p->pStrs,(uint)*pVVar1[uVar12].pArray >> 1);
            uVar13 = *pbVar10 - 0x5f;
            if (uVar13 == 0) {
              uVar13 = (uint)pbVar10[1];
            }
            if (uVar13 != 0) {
              __assert_fail("!strcmp(\"_\", Smt_VecEntryName(p, vFans2, 0))",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                            ,0x212,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
            }
            if (pVVar1[uVar12].nSize < 2) goto LAB_003119a8;
            if (pVVar1[uVar12].pArray[1] < 0) goto LAB_00311989;
            pcVar11 = Abc_NamStr(p->pStrs,(uint)pVVar1[uVar12].pArray[1] >> 1);
            iVar4 = strcmp("BitVec",pcVar11);
            if (iVar4 != 0) {
              __assert_fail("!strcmp(\"BitVec\", Smt_VecEntryName(p, vFans2, 1))",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                            ,0x213,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
            }
            if (pVVar1[uVar12].nSize < 3) goto LAB_003119a8;
            uVar12 = pVVar1[uVar12].pArray[2];
            if ((int)uVar12 < 0) goto LAB_00311989;
            if ((uVar12 & 1) == 0) {
              __assert_fail("Smt_EntryIsName(Fan)",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                            ,0x215,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
            }
            pcVar11 = Abc_NamStr(p->pStrs,uVar12 >> 1);
            iVar4 = atoi(pcVar11);
          }
          else {
            pcVar11 = Abc_NamStr(p->pStrs,uVar12 >> 1);
            iVar5 = strcmp("Bool",pcVar11);
            iVar4 = 1;
            if (iVar5 != 0) {
              __assert_fail("!strcmp(\"Bool\", Smt_VecEntryName(p, vFans, 3))",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                            ,0x207,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
            }
          }
          iVar5 = Wlc_ObjAlloc(p_01,1,0,iVar4 + -1,0);
          iVar6 = Abc_NamStrFindOrAdd(p_01->pManName,pcVar8,(int *)0x0);
          if (iVar5 != iVar6) {
            __assert_fail("iObj == NameId",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                          ,0x21c,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
          }
          Vec_IntPush(pVVar14,iVar5);
          Vec_IntPush(pVVar14,iVar16);
          Vec_IntPush(pVVar14,iVar4);
          iVar16 = iVar4 + iVar16;
          uVar12 = (p->vObjs).nSize;
        }
      }
      lVar18 = lVar18 + 1;
      lVar19 = lVar19 + 0x10;
    } while (lVar18 < (int)uVar12);
    if ((int)uVar12 < 1) goto LAB_00311717;
    lVar19 = 8;
    lVar18 = 0;
    do {
      pVVar14 = (p->vObjs).pArray;
      iVar16 = *(int *)((long)pVVar14 + lVar19 + -4);
      if (0 < iVar16) {
        piVar7 = *(int **)((long)&pVVar14->nCap + lVar19);
        iVar4 = *piVar7;
        if (iVar4 < 0) goto LAB_00311989;
        if (iVar4 == 9) {
          if (iVar16 != 5) {
            __assert_fail("Vec_IntSize(vFans) == 5",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                          ,0x226,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
          }
          uVar12 = piVar7[1];
          if ((int)uVar12 < 0) goto LAB_00311989;
          if ((uVar12 & 1) == 0) {
            __assert_fail("Smt_EntryIsName(Fan)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                          ,0x22a,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
          }
          pcVar8 = Abc_NamStr(p->pStrs,uVar12 >> 1);
          iVar16 = *(int *)((long)pVVar14 + lVar19 + -4);
          if (iVar16 < 3) {
LAB_003119a8:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          lVar2 = *(long *)((long)&pVVar14->nCap + lVar19);
          uVar12 = *(uint *)(lVar2 + 8);
          if ((int)uVar12 < 0) goto LAB_00311989;
          if ((uVar12 & 1) != 0) {
            __assert_fail("!Smt_EntryIsName(Fan)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                          ,0x22e,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
          }
          if (iVar16 == 3) goto LAB_003119a8;
          uVar12 = *(uint *)(lVar2 + 0xc);
          if ((int)uVar12 < 0) goto LAB_00311989;
          if ((uVar12 & 1) == 0) {
            uVar12 = uVar12 >> 1;
            if ((p->vObjs).nSize <= (int)uVar12) goto LAB_003119c7;
            pVVar1 = (p->vObjs).pArray;
            if (pVVar1[uVar12].nSize != 3) {
              __assert_fail("Vec_IntSize(vFans2) == 3",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                            ,0x246,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
            }
            if (*pVVar1[uVar12].pArray < 0) goto LAB_00311989;
            pbVar10 = (byte *)Abc_NamStr(p->pStrs,(uint)*pVVar1[uVar12].pArray >> 1);
            uVar13 = *pbVar10 - 0x5f;
            if (uVar13 == 0) {
              uVar13 = (uint)pbVar10[1];
            }
            if (uVar13 != 0) {
              __assert_fail("!strcmp(\"_\", Smt_VecEntryName(p, vFans2, 0))",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                            ,0x247,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
            }
            if (pVVar1[uVar12].nSize < 2) goto LAB_003119a8;
            if (pVVar1[uVar12].pArray[1] < 0) goto LAB_00311989;
            pcVar11 = Abc_NamStr(p->pStrs,(uint)pVVar1[uVar12].pArray[1] >> 1);
            iVar16 = strcmp("BitVec",pcVar11);
            if (iVar16 != 0) {
              __assert_fail("!strcmp(\"BitVec\", Smt_VecEntryName(p, vFans2, 1))",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                            ,0x248,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
            }
            if (pVVar1[uVar12].nSize < 3) goto LAB_003119a8;
            uVar12 = pVVar1[uVar12].pArray[2];
            if ((int)uVar12 < 0) goto LAB_00311989;
            if ((uVar12 & 1) == 0) {
              __assert_fail("Smt_EntryIsName(Fan)",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                            ,0x24b,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
            }
            pcVar11 = Abc_NamStr(p->pStrs,uVar12 >> 1);
            if (*(int *)((long)pVVar14 + lVar19 + -4) < 5) goto LAB_003119a8;
            iVar16 = atoi(pcVar11);
            iVar16 = Smt_PrsBuildNode(p_01,p,*(int *)(*(long *)((long)&pVVar14->nCap + lVar19) +
                                                     0x10),iVar16,pcVar8);
          }
          else {
            pcVar11 = Abc_NamStr(p->pStrs,uVar12 >> 1);
            iVar16 = strcmp("Bool",pcVar11);
            if (iVar16 != 0) {
              __assert_fail("!strcmp(\"Bool\", Smt_VecEntryName(p, vFans, 3))",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                            ,0x234,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
            }
            if (*(int *)((long)pVVar14 + lVar19 + -4) < 5) goto LAB_003119a8;
            uVar12 = *(uint *)(*(long *)((long)&pVVar14->nCap + lVar19) + 0x10);
            if ((int)uVar12 < 0) goto LAB_00311989;
            pcVar11 = Abc_NamStr(p->pStrs,uVar12 >> 1);
            iVar16 = strcmp("false",pcVar11);
            if (iVar16 == 0) {
              pcVar11 = "#b0";
            }
            else {
              iVar16 = strcmp("true",pcVar11);
              if (iVar16 != 0) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                              ,0x23b,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
              }
              pcVar11 = "#b1";
            }
            iVar16 = Smt_PrsBuildConstant(p_01,pcVar11,1,pcVar8);
          }
          if (iVar16 == 0) {
            Wlc_NtkFree(p_01);
            p_01 = (Wlc_Ntk_t *)0x0;
            goto LAB_0031194d;
          }
          uVar12 = (p->vObjs).nSize;
        }
      }
      lVar18 = lVar18 + 1;
      lVar19 = lVar19 + 0x10;
    } while (lVar18 < (int)uVar12);
    if ((int)uVar12 < 1) goto LAB_00311717;
    lVar18 = 0;
    do {
      pVVar14 = (p->vObjs).pArray;
      if (0 < pVVar14[lVar18].nSize) {
        iVar16 = *pVVar14[lVar18].pArray;
        if (iVar16 < 0) goto LAB_00311989;
        if (iVar16 == 0xf) {
          if (pVVar14[lVar18].nSize != 3) {
            __assert_fail("Vec_IntSize(vFans) == 3",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                          ,0x25c,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
          }
          uVar13 = pVVar14[lVar18].pArray[1];
          if ((int)uVar13 < 0) goto LAB_00311989;
          if ((uVar13 & 1) != 0) {
            __assert_fail("!Smt_EntryIsName(Fan)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                          ,0x260,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
          }
          uVar13 = uVar13 >> 1;
          if ((int)uVar12 <= (int)uVar13) goto LAB_003119c7;
          if (0 < pVVar14[uVar13].nSize) {
            if (*pVVar14[uVar13].pArray < 0) goto LAB_00311989;
            if (*pVVar14[uVar13].pArray != 0xf) {
              iVar16 = 0;
              do {
                uVar12 = *pVVar14[uVar13].pArray;
                if ((int)uVar12 < 0) goto LAB_00311989;
                if ((uVar12 & 1) != 0) {
                  __assert_fail("!Smt_EntryIsName(Fan)",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                                ,0x269,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
                }
                uVar12 = uVar12 >> 1;
                if ((p->vObjs).nSize <= (int)uVar12) goto LAB_003119c7;
                pVVar1 = (p->vObjs).pArray;
                if (pVVar1[uVar12].nSize < 1) goto LAB_003119a8;
                uVar17 = *pVVar1[uVar12].pArray;
                if ((int)uVar17 < 0) goto LAB_00311989;
                if ((uVar17 & 1) == 0) {
                  __assert_fail("Smt_EntryIsName(Fan3)",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                                ,0x26d,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
                }
                pcVar8 = Abc_NamStr(p->pStrs,uVar17 >> 1);
                if (pVVar1[uVar12].nSize < 2) goto LAB_003119a8;
                uVar12 = pVVar1[uVar12].pArray[1];
                if ((int)uVar12 < 0) goto LAB_00311989;
                if ((uVar12 & 1) != 0) {
                  __assert_fail("!Smt_EntryIsName(Fan3)",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                                ,0x271,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
                }
                iVar4 = Smt_PrsBuildNode(p_01,p,uVar12,-1,pcVar8);
                if (iVar4 == 0) goto LAB_00311761;
                iVar16 = iVar16 + 1;
              } while (iVar16 < pVVar14[uVar13].nSize);
              uVar12 = (p->vObjs).nSize;
            }
          }
        }
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 < (int)uVar12);
    p_00->nSize = 0;
    if ((int)uVar12 < 1) goto LAB_00311724;
    lVar18 = 0;
    do {
      pVVar14 = (p->vObjs).pArray;
      if (0 < pVVar14[lVar18].nSize) {
        iVar16 = *pVVar14[lVar18].pArray;
        if (iVar16 < 0) goto LAB_00311989;
        if (iVar16 == 0xd) {
          if (pVVar14[lVar18].nSize != 2) {
            __assert_fail("Vec_IntSize(vFans) == 2",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                          ,0x282,"Wlc_Ntk_t *Smt_PrsBuild(Smt_Prs_t *)");
          }
          uVar13 = pVVar14[lVar18].pArray[1];
          if ((int)uVar13 < 0) {
LAB_00311989:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                          ,0xf3,"int Abc_LitIsCompl(int)");
          }
          if ((uVar13 & 1) == 0) {
            uVar17 = uVar13 >> 1;
            if ((int)uVar12 <= (int)uVar17) goto LAB_003119c7;
            while( true ) {
              if (pVVar14[uVar17].nSize < 1) break;
              iVar16 = *pVVar14[uVar17].pArray;
              if (iVar16 < 0) goto LAB_00311989;
              if (iVar16 != 0xf) break;
              if ((uint)pVVar14[uVar17].nSize < 3) goto LAB_003119a8;
              uVar13 = pVVar14[uVar17].pArray[2];
              if ((int)uVar13 < 0) goto LAB_00311989;
              if ((uVar13 & 1) != 0) break;
              uVar17 = uVar13 >> 1;
              if (uVar12 <= uVar17) goto LAB_003119c7;
            }
          }
          iVar16 = Smt_PrsBuildNode(p_01,p,uVar13,-1,(char *)0x0);
          if (iVar16 == 0) goto LAB_00311761;
          Vec_IntPush(p_00,iVar16);
          uVar12 = (p->vObjs).nSize;
        }
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 < (int)uVar12);
    iVar16 = p_00->nSize;
    if (iVar16 != 1) goto LAB_00311726;
    uVar12 = Wlc_ObjAlloc(p_01,7,0,0,0);
    if (((int)uVar12 < 1) || (p_01->nObjsAlloc <= (int)uVar12)) goto LAB_00311bf5;
    Wlc_ObjAddFanins(p_01,p_01->pObjs + uVar12,p_00);
    pAVar9 = p_01->pManName;
    piVar7 = &local_38;
  }
  uVar13 = Abc_NamStrFindOrAdd(pAVar9,"miter_output",piVar7);
  if (*piVar7 != 0) {
    __assert_fail("!fFound",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                  ,0x125,"int Smt_PrsCreateNode(Wlc_Ntk_t *, int, int, int, Vec_Int_t *, char *)");
  }
  if (uVar12 != uVar13) {
    __assert_fail("iObj == NameId",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcReadSmt.c"
                  ,0x126,"int Smt_PrsCreateNode(Wlc_Ntk_t *, int, int, int, Vec_Int_t *, char *)");
  }
  if (p_01->nObjsAlloc <= (int)uVar12) {
LAB_00311bf5:
    __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlc.h"
                  ,0xa9,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
  }
  Wlc_ObjSetCo(p_01,p_01->pObjs + uVar12,0);
  uVar12 = p_01->iObj;
  uVar13 = 0x10;
  if (0xe < uVar12 - 1) {
    uVar13 = uVar12;
  }
  if (uVar13 == 0) {
    if ((int)uVar12 < 1) goto LAB_0031194d;
    __ptr = (void *)0x0;
LAB_00311880:
    auVar3 = _DAT_008403e0;
    lVar18 = (ulong)uVar12 - 1;
    auVar21._8_4_ = (int)lVar18;
    auVar21._0_8_ = lVar18;
    auVar21._12_4_ = (int)((ulong)lVar18 >> 0x20);
    uVar15 = 0;
    auVar21 = auVar21 ^ _DAT_008403e0;
    auVar22 = _DAT_008403d0;
    do {
      auVar23 = auVar22 ^ auVar3;
      if ((bool)(~(auVar23._4_4_ == auVar21._4_4_ && auVar21._0_4_ < auVar23._0_4_ ||
                  auVar21._4_4_ < auVar23._4_4_) & 1)) {
        *(int *)((long)__ptr + uVar15 * 4) = (int)uVar15;
      }
      if ((auVar23._12_4_ != auVar21._12_4_ || auVar23._8_4_ <= auVar21._8_4_) &&
          auVar23._12_4_ <= auVar21._12_4_) {
        *(int *)((long)__ptr + uVar15 * 4 + 4) = (int)uVar15 + 1;
      }
      uVar15 = uVar15 + 2;
      lVar18 = auVar22._8_8_;
      auVar22._0_8_ = auVar22._0_8_ + 2;
      auVar22._8_8_ = lVar18 + 2;
    } while ((uVar12 + 1 & 0xfffffffe) != uVar15);
    uVar15 = 1;
    if (1 < (int)uVar12) {
      uVar15 = (ulong)uVar12;
    }
    uVar20 = 0;
    do {
      Vec_IntPush(&p_01->vNameIds,*(int *)((long)__ptr + uVar20 * 4));
      uVar20 = uVar20 + 1;
    } while (uVar15 != uVar20);
  }
  else {
    __ptr = malloc((long)(int)uVar13 << 2);
    if (0 < (int)uVar12) goto LAB_00311880;
    if (__ptr == (void *)0x0) goto LAB_0031194d;
  }
  free(__ptr);
LAB_0031194d:
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
  }
  free(p_00);
  return p_01;
LAB_00311761:
  Wlc_NtkFree(p_01);
  p_01 = (Wlc_Ntk_t *)0x0;
  goto LAB_0031194d;
}

Assistant:

Wlc_Ntk_t * Smt_PrsBuild( Smt_Prs_t * p )
{
    Wlc_Ntk_t * pNtk;
    Vec_Int_t * vFans, * vFans2, * vFans3; 
    Vec_Int_t * vAsserts = Vec_IntAlloc(100);
    char * pName, * pRange, * pValue;
    int i, k, Fan, Fan3, iObj, Status, Range, NameId, nBits = 0;
    // issue warnings about unknown dirs
    vFans = Vec_WecEntry( &p->vObjs, 0 );
    Vec_IntForEachEntry( vFans, Fan, i )
    {
        assert( !Smt_EntryIsName(Fan) );
        vFans2 = Smt_VecEntryNode( p, vFans, i );
        Fan = Vec_IntEntry(vFans2, 0);
        assert( Smt_EntryIsName(Fan) );
        if ( Abc_Lit2Var(Fan) >= SMT_PRS_END )
            printf( "Ignoring directive \"%s\".\n", Smt_EntryName(p, Fan) );
    }
    // start network and create primary inputs
    pNtk = Wlc_NtkAlloc( p->pName, 1000 );
    pNtk->pManName = Abc_NamStart( 1000, 24 );
    pNtk->fSmtLib = 1;
    Smt_ManForEachDir( p, SMT_PRS_DECLARE_FUN, vFans, i )
    {
        assert( Vec_IntSize(vFans) == 4 );
        assert( Smt_VecEntryIsType(vFans, 0, SMT_PRS_DECLARE_FUN) );
        // get name
        Fan = Vec_IntEntry(vFans, 1);
        assert( Smt_EntryIsName(Fan) );
        pName = Smt_EntryName(p, Fan);
        // skip ()
        Fan = Vec_IntEntry(vFans, 2);
        assert( !Smt_EntryIsName(Fan) );
        // check type (Bool or BitVec)
        Fan = Vec_IntEntry(vFans, 3);
        if ( Smt_EntryIsName(Fan) ) 
        {
            //(declare-fun s1 () Bool)
            assert( !strcmp("Bool", Smt_VecEntryName(p, vFans, 3)) );
            Range = 1;
        }
        else
        {
            // (declare-fun s1 () (_ BitVec 64))
            // get range
            Fan = Vec_IntEntry(vFans, 3);
            assert( !Smt_EntryIsName(Fan) );
            vFans2 = Smt_EntryNode(p, Fan);
            assert( Vec_IntSize(vFans2) == 3 );
            assert( !strcmp("_", Smt_VecEntryName(p, vFans2, 0)) );
            assert( !strcmp("BitVec", Smt_VecEntryName(p, vFans2, 1)) );
            Fan = Vec_IntEntry(vFans2, 2);
            assert( Smt_EntryIsName(Fan) );
            pRange = Smt_EntryName(p, Fan);
            Range = atoi(pRange);
        }
        // create node
        iObj = Wlc_ObjAlloc( pNtk, WLC_OBJ_PI, 0, Range-1, 0 );
        NameId = Abc_NamStrFindOrAdd( pNtk->pManName, pName, NULL );
        assert( iObj == NameId );
        // save values
        Vec_IntPush( &pNtk->vValues, NameId );
        Vec_IntPush( &pNtk->vValues, nBits );
        Vec_IntPush( &pNtk->vValues, Range );
        nBits += Range;
    }
    // create constants
    Smt_ManForEachDir( p, SMT_PRS_DEFINE_FUN, vFans, i )
    {
        assert( Vec_IntSize(vFans) == 5 );
        assert( Smt_VecEntryIsType(vFans, 0, SMT_PRS_DEFINE_FUN) );
        // get name
        Fan = Vec_IntEntry(vFans, 1);
        assert( Smt_EntryIsName(Fan) );
        pName = Smt_EntryName(p, Fan);
        // skip ()
        Fan = Vec_IntEntry(vFans, 2);
        assert( !Smt_EntryIsName(Fan) );
        // check type (Bool or BitVec)
        Fan = Vec_IntEntry(vFans, 3);
        if ( Smt_EntryIsName(Fan) ) 
        {
            // (define-fun s_2 () Bool false)
            assert( !strcmp("Bool", Smt_VecEntryName(p, vFans, 3)) );
            Range = 1;
            pValue = Smt_VecEntryName(p, vFans, 4);
            if ( !strcmp("false", pValue) )
                pValue = "#b0";
            else if ( !strcmp("true", pValue) )
                pValue = "#b1";
            else assert( 0 );
            Status = Smt_PrsBuildConstant( pNtk, pValue, Range, pName );
        }
        else
        {
            // (define-fun s702 () (_ BitVec 4) #xe)
            // (define-fun s1 () (_ BitVec 8) (bvneg #x7f))
            // get range
            Fan = Vec_IntEntry(vFans, 3);
            assert( !Smt_EntryIsName(Fan) );
            vFans2 = Smt_VecEntryNode(p, vFans, 3);
            assert( Vec_IntSize(vFans2) == 3 );
            assert( !strcmp("_", Smt_VecEntryName(p, vFans2, 0)) );
            assert( !strcmp("BitVec", Smt_VecEntryName(p, vFans2, 1)) );
            // get range
            Fan = Vec_IntEntry(vFans2, 2);
            assert( Smt_EntryIsName(Fan) );
            pRange = Smt_EntryName(p, Fan);
            Range = atoi(pRange);
            // get constant
            Fan = Vec_IntEntry(vFans, 4);
            Status = Smt_PrsBuildNode( pNtk, p, Fan, Range, pName );
        }        
        if ( !Status )
        {
            Wlc_NtkFree( pNtk ); pNtk = NULL;
            goto finish;
        }
    }
    // process let-statements
    Smt_ManForEachDir( p, SMT_PRS_LET, vFans, i )
    {
        // let ((s35550 (bvor s48 s35549)))
        assert( Vec_IntSize(vFans) == 3 );
        assert( Smt_VecEntryIsType(vFans, 0, SMT_PRS_LET) );
        // get parts
        Fan = Vec_IntEntry(vFans, 1);
        assert( !Smt_EntryIsName(Fan) );
        vFans2 = Smt_EntryNode(p, Fan);
        if ( Smt_VecEntryIsType(vFans2, 0, SMT_PRS_LET) )
            continue;
        // iterate through the parts
        Vec_IntForEachEntry( vFans2, Fan, k )
        {
            // s35550 (bvor s48 s35549)
            Fan = Vec_IntEntry(vFans2, 0);
            assert( !Smt_EntryIsName(Fan) );
            vFans3 = Smt_EntryNode(p, Fan);
            // get the name
            Fan3 = Vec_IntEntry(vFans3, 0);
            assert( Smt_EntryIsName(Fan3) );
            pName = Smt_EntryName(p, Fan3);
            // get function
            Fan3 = Vec_IntEntry(vFans3, 1);
            assert( !Smt_EntryIsName(Fan3) );
            Status = Smt_PrsBuildNode( pNtk, p, Fan3, -1, pName );
            if ( !Status )
            {
                Wlc_NtkFree( pNtk ); pNtk = NULL;
                goto finish;
            }
        }
    }
    // process assert-statements
    Vec_IntClear( vAsserts );
    Smt_ManForEachDir( p, SMT_PRS_ASSERT, vFans, i )
    {
        //(assert ; no quantifiers
        //   (let ((s2 (bvsge s0 s1)))
        //   (not s2)))
        //(assert (not (= s0 #x00)))
        assert( Vec_IntSize(vFans) == 2 );
        assert( Smt_VecEntryIsType(vFans, 0, SMT_PRS_ASSERT) );
        // get second directive
        Fan = Vec_IntEntry(vFans, 1);
        if ( !Smt_EntryIsName(Fan) )
        {
            // find the final let-statement
            vFans2 = Smt_VecEntryNode(p, vFans, 1);
            while ( Smt_VecEntryIsType(vFans2, 0, SMT_PRS_LET) )
            {
                Fan = Vec_IntEntry(vFans2, 2);
                if ( Smt_EntryIsName(Fan) )
                    break;
                vFans2 = Smt_VecEntryNode(p, vFans2, 2);
            }
        }
        // find name or create node
        iObj = Smt_PrsBuildNode( pNtk, p, Fan, -1, NULL );
        if ( !iObj )
        {
            Wlc_NtkFree( pNtk ); pNtk = NULL;
            goto finish;
        }
        Vec_IntPush( vAsserts, iObj );
    }
    // build AND of asserts
    if ( Vec_IntSize(vAsserts) == 1 )
        iObj = Smt_PrsCreateNode( pNtk, WLC_OBJ_BUF, 0, 1, vAsserts, "miter_output" );
    else
    {
        iObj = Smt_PrsCreateNode( pNtk, WLC_OBJ_BIT_CONCAT, 0, Vec_IntSize(vAsserts), vAsserts, NULL );
        Vec_IntFill( vAsserts, 1, iObj );
        iObj = Smt_PrsCreateNode( pNtk, WLC_OBJ_REDUCT_AND, 0, 1, vAsserts, "miter_output" );
    }
    Wlc_ObjSetCo( pNtk, Wlc_NtkObj(pNtk, iObj), 0 );
    // create nameIDs
    vFans = Vec_IntStartNatural( Wlc_NtkObjNumMax(pNtk) );
    Vec_IntAppend( &pNtk->vNameIds, vFans );
    Vec_IntFree( vFans );
    //Wlc_NtkReport( pNtk, NULL );
finish:
    // cleanup
    Vec_IntFree(vAsserts);
    return pNtk;
}